

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

void init_array_internal(double *a,int ndim,int *dims)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  int idx [7];
  
  uVar2 = 0;
  uVar4 = (ulong)(uint)ndim;
  if (ndim < 1) {
    uVar4 = uVar2;
  }
  uVar5 = 1;
  for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
    uVar5 = uVar5 * dims[uVar2];
  }
  uVar6 = 0;
  uVar2 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar2 = uVar6;
  }
  for (; uVar6 != uVar2; uVar6 = uVar6 + 1) {
    uVar3 = uVar6;
    for (uVar7 = 0; iVar1 = (int)uVar3, uVar4 != uVar7; uVar7 = uVar7 + 1) {
      uVar3 = (long)iVar1 / (long)dims[uVar7];
      idx[uVar7] = iVar1 % dims[uVar7];
    }
    dVar8 = 0.0;
    dVar9 = 1.0;
    for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      dVar8 = dVar8 + (double)idx[uVar3] * dVar9;
      dVar9 = dVar9 * 100.0;
    }
    a[uVar6] = dVar8;
  }
  return;
}

Assistant:

void init_array_internal(double *a, int ndim, int dims[])
{
    int idx[GA_MAX_DIM];
    int i,dim, elems;

        elems = 1;
        for(i=0;i<ndim;i++)elems *= dims[i];

     for(i=0; i<elems; i++){
        int Index = i;
        double field, val;
        
        for(dim = 0; dim < ndim; dim++){
            idx[dim] = Index%dims[dim];
            Index /= dims[dim];
        }
        
                field=1.; val=0.;
        for(dim=0; dim< ndim;dim++){
            val += field*idx[dim];
            field *= BASE;
        }
        a[i] = val;
        /* printf("(%d,%d,%d)=%6.0f",idx[0],idx[1],idx[2],val); */
    }
}